

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::IsValidAndNotZeroAndNotIdentity(ON_Xform *this,double zero_tolerance)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  uVar3 = 0;
  while (uVar3 < 0x80) {
    pdVar1 = (double *)((long)this->m_xform[0] + uVar3);
    uVar3 = uVar3 + 8;
    if (1.23432101234321e+308 <= ABS(*pdVar1)) {
      return false;
    }
  }
  if (zero_tolerance < 0.0) {
    return false;
  }
  if (zero_tolerance < 1.23432101234321e+308) {
    lVar6 = 0;
    iVar4 = 0;
    iVar5 = 0;
    while( true ) {
      dVar2 = *(double *)((long)this->m_xform[0] + lVar6);
      if (ABS(1.0 - dVar2) <= zero_tolerance) {
        if (0 < iVar4) {
          return true;
        }
        iVar5 = iVar5 + 1;
      }
      else {
        if (zero_tolerance < ABS(dVar2)) {
          return true;
        }
        if (0 < iVar5) {
          return true;
        }
        iVar4 = iVar4 + 1;
      }
      if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar6 + 8))) {
        return true;
      }
      if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar6 + 0x10))) break;
      if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar6 + 0x18))) {
        return true;
      }
      if (zero_tolerance < ABS(*(double *)((long)this->m_xform[1] + lVar6))) {
        return true;
      }
      lVar6 = lVar6 + 0x28;
      if ((int)lVar6 == 0x78) {
        if (zero_tolerance < ABS(1.0 - this->m_xform[3][3])) {
          return true;
        }
        return iVar4 != 3 && iVar5 != 3;
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool ON_Xform::IsValidAndNotZeroAndNotIdentity(
  double zero_tolerance
) const
{
  if (false == IsValid())
    return false;

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  int one_count = 0;
  int zero_count = 0;
  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if (fabs(1.0 - *v) <= zero_tolerance)
    {
      // this diagonal coefficient = 1
      one_count++;
      if (zero_count > 0)
        return true;
    }
    else if (fabs(*v) <= zero_tolerance)
    {
      // this diagonal coefficient = 0
      zero_count++;
      if (one_count > 0)
        return true;
    }
    else
    {
      // this diagonal coefficient != 1 and != 0
      return true;
    }

    // If any off diagonal coefficient is not zero, return true
    v++;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return true;
  }

  if (!(fabs(1.0 - *v) <= zero_tolerance))
  {
    if (3 == zero_count && fabs(1.0 - *v) <= zero_tolerance)
      return false; // every matrix coefficient = 0

    // otherwise, xform[3][3] != 1 so return true.
    return true;
  }

  if (3 == one_count || 3 == zero_count)
    return false;

  return true;
}